

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KInstPrinter.c
# Opt level: O1

void registerBits(SStream *O,cs_m68k_op *op)

{
  uint uVar1;
  char *pcVar2;
  char buffer [128];
  char local_a8 [136];
  
  pcVar2 = local_a8;
  uVar1 = op->register_bits;
  local_a8[0] = '\0';
  if (uVar1 == 0) {
    pcVar2 = "#$0";
  }
  else {
    printRegbitsRange(local_a8,uVar1 & 0xff,"d");
    printRegbitsRange(local_a8,uVar1 >> 8 & 0xff,"a");
    printRegbitsRange(local_a8,uVar1 >> 0x10 & 0xff,"fp");
  }
  SStream_concat(O,"%s",pcVar2);
  return;
}

Assistant:

static void registerBits(SStream* O, const cs_m68k_op* op)
{
	char buffer[128];
	unsigned int data = op->register_bits;

	buffer[0] = 0;

	if (!data) {
		SStream_concat(O, "%s", "#$0");
		return;
	}

	printRegbitsRange(buffer, data & 0xff, "d");
	printRegbitsRange(buffer, (data >> 8) & 0xff, "a");
	printRegbitsRange(buffer, (data >> 16) & 0xff, "fp");

	SStream_concat(O, "%s", buffer);
}